

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_fan(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint offs;
  envy_bios_power_fan *peVar4;
  int err;
  uint32_t data;
  envy_bios_power_fan *fan;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).fan;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).fan.version);
    if ((bios->power).fan.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).fan.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).fan.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).fan.entriesnum);
      (bios->power).fan.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      offs = peVar4->offset + (uint)(bios->power).fan.hlen;
      bios_u8(bios,offs,&(bios->power).fan.type);
      bios_u8(bios,offs + 2,&(bios->power).fan.duty_min);
      bios_u8(bios,offs + 3,&(bios->power).fan.duty_max);
      bios_u32(bios,offs + 0xb,&(bios->power).fan.divisor);
      (bios->power).fan.divisor = (bios->power).fan.divisor & 0xffffff;
      bios_u16(bios,offs + 0xe,&(bios->power).fan.unk0e);
      bios_u16(bios,offs + 0x10,&(bios->power).fan.unk10);
      bios_u16(bios,offs + 0x14,&(bios->power).fan.unboost_unboost_ms);
      bios_u8(bios,offs + 0x17,&(bios->power).fan.duty_boosted);
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN table version 0x%x\n",(ulong)(bios->power).fan.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_fan(struct envy_bios *bios) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	uint32_t data;
	int err = 0;

	if (!fan->offset)
		return -EINVAL;

	bios_u8(bios, fan->offset + 0x0, &fan->version);
	switch(fan->version) {
	case 0x10:
		err |= bios_u8(bios, fan->offset + 0x1, &fan->hlen);
		err |= bios_u8(bios, fan->offset + 0x2, &fan->rlen);
		err |= bios_u8(bios, fan->offset + 0x3, &fan->entriesnum);

		fan->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN table version 0x%x\n", fan->version);
		return -EINVAL;
	};

	/* go to the first entry */
	data = fan->offset + fan->hlen;

	bios_u8(bios, data + 0x00, &fan->type);
	bios_u8(bios, data + 0x02, &fan->duty_min);
	bios_u8(bios, data + 0x03, &fan->duty_max);
	/* 0x10 == constant to 9? */
	bios_u32(bios, data + 0x0b, &fan->divisor); fan->divisor &= 0xffffff;
	bios_u16(bios, data + 0x0e, &fan->unk0e); /* looks like the fan bump delay */
	bios_u16(bios, data + 0x10, &fan->unk10); /* looks like the fan slow down delay */
	bios_u16(bios, data + 0x14, &fan->unboost_unboost_ms);
	bios_u8(bios, data + 0x17, &fan->duty_boosted); /* threshold = 96 °C */

	/* temp fan bump min = 45°C */
	/* temp fan max = 95°C */

	return 0;
}